

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>::call
          (unary<tcu::Vector<double,_3>,_tcu::Vector<double,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Vector<double,_3> arg;
  Vector<double,_3> result;
  Vector<double,_3> local_78;
  Vector<double,_3> local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  tcu::Vector<double,_3>::Vector(&local_58);
  tcu::Vector<double,_3>::Vector(&local_78);
  local_78.m_data[2] = *(double *)((long)argument_src + 0x10);
  local_78.m_data[0]._0_4_ = *argument_src;
  local_78.m_data[0]._4_4_ = *(undefined4 *)((long)argument_src + 4);
  local_78.m_data[1]._0_4_ = *(undefined4 *)((long)argument_src + 8);
  local_78.m_data[1]._4_4_ = *(undefined4 *)((long)argument_src + 0xc);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_40,&local_78);
  *(undefined8 *)((long)result_dst + 0x10) = local_30;
  *(undefined8 *)result_dst = local_40;
  *(undefined8 *)((long)result_dst + 8) = uStack_38;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}